

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsCopyStringUtf16(JsValueRef value,int start,int length,uint16_t *buffer,size_t *written)

{
  JsErrorCode JVar1;
  char16 *pcVar2;
  ulong uVar3;
  WCHAR *local_40;
  char16 *str;
  size_t strLength;
  
  if (value == (JsValueRef)0x0) {
    JVar1 = JsErrorNullArgument;
  }
  else {
    if (written != (size_t *)0x0) {
      *written = 0;
    }
    local_40 = (WCHAR *)0x0;
    str = (char16 *)0x0;
    JVar1 = JsStringToPointer(value,&local_40,(size_t *)&str);
    if ((JVar1 == JsNoError) && (JVar1 = JsErrorInvalidArgument, -1 < start)) {
      pcVar2 = (char16 *)(ulong)(uint)start;
      if (pcVar2 <= str) {
        uVar3 = (long)length;
        if ((ulong)((long)str - (long)pcVar2) < (ulong)(long)length) {
          uVar3 = (long)str - (long)pcVar2;
        }
        JVar1 = JsNoError;
        if (uVar3 != 0) {
          if (buffer != (uint16_t *)0x0) {
            memmove_xplat(buffer,local_40 + (long)pcVar2,uVar3 * 2);
          }
          if (written != (size_t *)0x0) {
            *written = uVar3;
            JVar1 = JsNoError;
          }
        }
      }
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API JsCopyStringUtf16(
    _In_ JsValueRef value,
    _In_ int start,
    _In_ int length,
    _Out_opt_ uint16_t* buffer,
    _Out_opt_ size_t* written)
{
    PARAM_NOT_NULL(value);
    VALIDATE_JSREF(value);

    return WriteStringCopy(value, start, length, written,
        [buffer](const char16* src, size_t count, size_t *needed)
        {
            if (buffer)
            {
                memmove(buffer, src, sizeof(char16) * count);
            }
            return JsNoError;
        });
}